

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O2

int unres_schema_find(unres_schema *unres,int start_on_backwards,void *item,UNRES_ITEM type)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  
  if (unres->count == 0) {
    iVar3 = -1;
  }
  else {
    uVar4 = (ulong)(unres->count - 1);
    if (-1 < start_on_backwards) {
      uVar4 = (ulong)(uint)start_on_backwards;
    }
    while (iVar3 = (int)uVar4, -1 < iVar3) {
      if (unres->type[uVar4] == type) {
        plVar1 = (long *)unres->item[uVar4];
        if (type == UNRES_LIST_UNIQ) {
          if ((*plVar1 == *item) &&
             (iVar2 = ly_strequal_((char *)plVar1[1],*(char **)((long)item + 8)), iVar2 != 0)) {
            return iVar3;
          }
        }
        else if (plVar1 == (long *)item) {
          return iVar3;
        }
      }
      uVar4 = (ulong)(iVar3 - 1);
    }
  }
  return iVar3;
}

Assistant:

int
unres_schema_find(struct unres_schema *unres, int start_on_backwards, void *item, enum UNRES_ITEM type)
{
    int i;
    struct unres_list_uniq *aux_uniq1, *aux_uniq2;

    if (!unres->count) {
        return -1;
    }

    if (start_on_backwards >= 0) {
        i = start_on_backwards;
    } else {
        i = unres->count - 1;
    }
    for (; i > -1; i--) {
        if (unres->type[i] != type) {
            continue;
        }
        if (type != UNRES_LIST_UNIQ) {
            if (unres->item[i] == item) {
                break;
            }
        } else {
            aux_uniq1 = (struct unres_list_uniq *)unres->item[i];
            aux_uniq2 = (struct unres_list_uniq *)item;
            if ((aux_uniq1->list == aux_uniq2->list) && ly_strequal(aux_uniq1->expr, aux_uniq2->expr, 0)) {
                break;
            }
        }
    }

    return i;
}